

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffArrayExpr(NodeDiffComputer *this,ArrayExpr *lhs,ArrayExpr *rhs)

{
  size_type_conflict sVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  ulong uVar6;
  
  sVar1 = (lhs->_inits)._size;
  iVar2 = sVar1 - (rhs->_inits)._size;
  if (iVar2 == 0) {
    if (sVar1 == 0) {
      iVar4 = 0;
    }
    else {
      uVar6 = 0;
      iVar4 = 0;
      do {
        iVar3 = diffNodes(this,&(lhs->_inits)._vals[uVar6]->super_Node,
                          &(rhs->_inits)._vals[uVar6]->super_Node);
        if (this->limit < iVar3) {
          return iVar3;
        }
        iVar4 = iVar4 + iVar3;
        uVar6 = uVar6 + 1;
      } while (uVar6 < (lhs->_inits)._size);
    }
  }
  else {
    iVar5 = -iVar2;
    if (0 < iVar2) {
      iVar5 = iVar2;
    }
    iVar4 = iVar5 * (this->DiffCosts).SizeDiffCoeff + (this->DiffCosts).SizeDiffCost;
  }
  return iVar4;
}

Assistant:

int32_t diffArrayExpr(const ArrayExpr *lhs, const ArrayExpr *rhs) {
    const auto &leftInits = lhs->initializers();
    const auto &rightInits = rhs->initializers();

    if (leftInits.size() != rightInits.size())
      return sizeDiff(leftInits.size(), rightInits.size());

    int32_t result = 0;

    for (int32_t i = 0; i < leftInits.size(); ++i) {
      const Expr *l = leftInits[i];
      const Expr *r = rightInits[i];

      int32_t tmp = diffNodes(l, r);

      if (tmp > limit)
        return tmp;

      result += tmp;
    }

    return result;
  }